

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

shared_ptr<create::Packet> __thiscall create::Data::getPacket(Data *this,uint8_t id)

{
  bool bVar1;
  __shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint8_t in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000031;
  shared_ptr<create::Packet> sVar4;
  key_type local_11;
  
  bVar1 = isValidPacketID((Data *)CONCAT71(in_register_00000031,id),in_DL);
  if (bVar1) {
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[]((map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                            *)CONCAT71(in_register_00000031,id),&local_11)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    *(undefined8 *)&(this->packets)._M_t._M_impl = 0;
    *(undefined8 *)&(this->packets)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<create::Packet>)
         sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Packet> Data::getPacket(uint8_t id) {
    if (isValidPacketID(id)) {
      return packets[id];
    }
    return std::shared_ptr<Packet>();
  }